

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharInfo.cpp
# Opt level: O1

int slang::charWidthUnicode(uint32_t c)

{
  bool bVar1;
  int iVar2;
  uint32_t local_10;
  uint32_t local_c;
  
  if (charWidthUnicode(unsigned_int)::CombiningCharacters == '\0') {
    charWidthUnicode();
  }
  local_10 = c;
  bVar1 = std::
          binary_search<__gnu_cxx::__normal_iterator<slang::UnicodeCharRange_const*,std::span<slang::UnicodeCharRange_const,18446744073709551615ul>>,unsigned_int>
                    ((__normal_iterator<const_slang::UnicodeCharRange_*,_std::span<const_slang::UnicodeCharRange,_18446744073709551615UL>_>
                      )charWidthUnicode::CombiningCharacters.ranges._M_ptr,
                     charWidthUnicode::CombiningCharacters.ranges._M_ptr +
                     charWidthUnicode::CombiningCharacters.ranges._M_extent._M_extent_value,
                     &local_10);
  iVar2 = 0;
  if (!bVar1) {
    if (charWidthUnicode(unsigned_int)::DoubleWidthCharacters == '\0') {
      charWidthUnicode();
    }
    local_c = c;
    bVar1 = std::
            binary_search<__gnu_cxx::__normal_iterator<slang::UnicodeCharRange_const*,std::span<slang::UnicodeCharRange_const,18446744073709551615ul>>,unsigned_int>
                      ((__normal_iterator<const_slang::UnicodeCharRange_*,_std::span<const_slang::UnicodeCharRange,_18446744073709551615UL>_>
                        )charWidthUnicode::DoubleWidthCharacters.ranges._M_ptr,
                       charWidthUnicode::DoubleWidthCharacters.ranges._M_ptr +
                       charWidthUnicode::DoubleWidthCharacters.ranges._M_extent._M_extent_value,
                       &local_c);
    iVar2 = bVar1 + 1;
  }
  return iVar2;
}

Assistant:

int charWidthUnicode(uint32_t c) {
    SLANG_ASSERT(isPrintableUnicode(c));

    // Sorted list of non-spacing and enclosing combining mark intervals as
    // defined in "3.6 Combination" of
    // http://www.unicode.org/versions/Unicode6.2.0/UnicodeStandard-6.2.pdf
    static const UnicodeCharRange CombiningCharacterRanges[] = {
        {0x0300, 0x036F},   {0x0483, 0x0489},   {0x0591, 0x05BD},   {0x05BF, 0x05BF},
        {0x05C1, 0x05C2},   {0x05C4, 0x05C5},   {0x05C7, 0x05C7},   {0x0610, 0x061A},
        {0x064B, 0x065F},   {0x0670, 0x0670},   {0x06D6, 0x06DC},   {0x06DF, 0x06E4},
        {0x06E7, 0x06E8},   {0x06EA, 0x06ED},   {0x0711, 0x0711},   {0x0730, 0x074A},
        {0x07A6, 0x07B0},   {0x07EB, 0x07F3},   {0x0816, 0x0819},   {0x081B, 0x0823},
        {0x0825, 0x0827},   {0x0829, 0x082D},   {0x0859, 0x085B},   {0x08E4, 0x08FE},
        {0x0900, 0x0902},   {0x093A, 0x093A},   {0x093C, 0x093C},   {0x0941, 0x0948},
        {0x094D, 0x094D},   {0x0951, 0x0957},   {0x0962, 0x0963},   {0x0981, 0x0981},
        {0x09BC, 0x09BC},   {0x09C1, 0x09C4},   {0x09CD, 0x09CD},   {0x09E2, 0x09E3},
        {0x0A01, 0x0A02},   {0x0A3C, 0x0A3C},   {0x0A41, 0x0A42},   {0x0A47, 0x0A48},
        {0x0A4B, 0x0A4D},   {0x0A51, 0x0A51},   {0x0A70, 0x0A71},   {0x0A75, 0x0A75},
        {0x0A81, 0x0A82},   {0x0ABC, 0x0ABC},   {0x0AC1, 0x0AC5},   {0x0AC7, 0x0AC8},
        {0x0ACD, 0x0ACD},   {0x0AE2, 0x0AE3},   {0x0B01, 0x0B01},   {0x0B3C, 0x0B3C},
        {0x0B3F, 0x0B3F},   {0x0B41, 0x0B44},   {0x0B4D, 0x0B4D},   {0x0B56, 0x0B56},
        {0x0B62, 0x0B63},   {0x0B82, 0x0B82},   {0x0BC0, 0x0BC0},   {0x0BCD, 0x0BCD},
        {0x0C3E, 0x0C40},   {0x0C46, 0x0C48},   {0x0C4A, 0x0C4D},   {0x0C55, 0x0C56},
        {0x0C62, 0x0C63},   {0x0CBC, 0x0CBC},   {0x0CBF, 0x0CBF},   {0x0CC6, 0x0CC6},
        {0x0CCC, 0x0CCD},   {0x0CE2, 0x0CE3},   {0x0D41, 0x0D44},   {0x0D4D, 0x0D4D},
        {0x0D62, 0x0D63},   {0x0DCA, 0x0DCA},   {0x0DD2, 0x0DD4},   {0x0DD6, 0x0DD6},
        {0x0E31, 0x0E31},   {0x0E34, 0x0E3A},   {0x0E47, 0x0E4E},   {0x0EB1, 0x0EB1},
        {0x0EB4, 0x0EB9},   {0x0EBB, 0x0EBC},   {0x0EC8, 0x0ECD},   {0x0F18, 0x0F19},
        {0x0F35, 0x0F35},   {0x0F37, 0x0F37},   {0x0F39, 0x0F39},   {0x0F71, 0x0F7E},
        {0x0F80, 0x0F84},   {0x0F86, 0x0F87},   {0x0F8D, 0x0F97},   {0x0F99, 0x0FBC},
        {0x0FC6, 0x0FC6},   {0x102D, 0x1030},   {0x1032, 0x1037},   {0x1039, 0x103A},
        {0x103D, 0x103E},   {0x1058, 0x1059},   {0x105E, 0x1060},   {0x1071, 0x1074},
        {0x1082, 0x1082},   {0x1085, 0x1086},   {0x108D, 0x108D},   {0x109D, 0x109D},
        {0x135D, 0x135F},   {0x1712, 0x1714},   {0x1732, 0x1734},   {0x1752, 0x1753},
        {0x1772, 0x1773},   {0x17B4, 0x17B5},   {0x17B7, 0x17BD},   {0x17C6, 0x17C6},
        {0x17C9, 0x17D3},   {0x17DD, 0x17DD},   {0x180B, 0x180D},   {0x18A9, 0x18A9},
        {0x1920, 0x1922},   {0x1927, 0x1928},   {0x1932, 0x1932},   {0x1939, 0x193B},
        {0x1A17, 0x1A18},   {0x1A56, 0x1A56},   {0x1A58, 0x1A5E},   {0x1A60, 0x1A60},
        {0x1A62, 0x1A62},   {0x1A65, 0x1A6C},   {0x1A73, 0x1A7C},   {0x1A7F, 0x1A7F},
        {0x1B00, 0x1B03},   {0x1B34, 0x1B34},   {0x1B36, 0x1B3A},   {0x1B3C, 0x1B3C},
        {0x1B42, 0x1B42},   {0x1B6B, 0x1B73},   {0x1B80, 0x1B81},   {0x1BA2, 0x1BA5},
        {0x1BA8, 0x1BA9},   {0x1BAB, 0x1BAB},   {0x1BE6, 0x1BE6},   {0x1BE8, 0x1BE9},
        {0x1BED, 0x1BED},   {0x1BEF, 0x1BF1},   {0x1C2C, 0x1C33},   {0x1C36, 0x1C37},
        {0x1CD0, 0x1CD2},   {0x1CD4, 0x1CE0},   {0x1CE2, 0x1CE8},   {0x1CED, 0x1CED},
        {0x1CF4, 0x1CF4},   {0x1DC0, 0x1DE6},   {0x1DFC, 0x1DFF},   {0x20D0, 0x20F0},
        {0x2CEF, 0x2CF1},   {0x2D7F, 0x2D7F},   {0x2DE0, 0x2DFF},   {0x302A, 0x302D},
        {0x3099, 0x309A},   {0xA66F, 0xA672},   {0xA674, 0xA67D},   {0xA69F, 0xA69F},
        {0xA6F0, 0xA6F1},   {0xA802, 0xA802},   {0xA806, 0xA806},   {0xA80B, 0xA80B},
        {0xA825, 0xA826},   {0xA8C4, 0xA8C4},   {0xA8E0, 0xA8F1},   {0xA926, 0xA92D},
        {0xA947, 0xA951},   {0xA980, 0xA982},   {0xA9B3, 0xA9B3},   {0xA9B6, 0xA9B9},
        {0xA9BC, 0xA9BC},   {0xAA29, 0xAA2E},   {0xAA31, 0xAA32},   {0xAA35, 0xAA36},
        {0xAA43, 0xAA43},   {0xAA4C, 0xAA4C},   {0xAAB0, 0xAAB0},   {0xAAB2, 0xAAB4},
        {0xAAB7, 0xAAB8},   {0xAABE, 0xAABF},   {0xAAC1, 0xAAC1},   {0xAAEC, 0xAAED},
        {0xAAF6, 0xAAF6},   {0xABE5, 0xABE5},   {0xABE8, 0xABE8},   {0xABED, 0xABED},
        {0xFB1E, 0xFB1E},   {0xFE00, 0xFE0F},   {0xFE20, 0xFE26},   {0x101FD, 0x101FD},
        {0x10A01, 0x10A03}, {0x10A05, 0x10A06}, {0x10A0C, 0x10A0F}, {0x10A38, 0x10A3A},
        {0x10A3F, 0x10A3F}, {0x11001, 0x11001}, {0x11038, 0x11046}, {0x11080, 0x11081},
        {0x110B3, 0x110B6}, {0x110B9, 0x110BA}, {0x11100, 0x11102}, {0x11127, 0x1112B},
        {0x1112D, 0x11134}, {0x11180, 0x11181}, {0x111B6, 0x111BE}, {0x116AB, 0x116AB},
        {0x116AD, 0x116AD}, {0x116B0, 0x116B5}, {0x116B7, 0x116B7}, {0x16F8F, 0x16F92},
        {0x1D167, 0x1D169}, {0x1D17B, 0x1D182}, {0x1D185, 0x1D18B}, {0x1D1AA, 0x1D1AD},
        {0x1D242, 0x1D244}, {0xE0100, 0xE01EF},
    };
    static const UnicodeCharSet CombiningCharacters(CombiningCharacterRanges);

    if (CombiningCharacters.contains(c))
        return 0;

    static const UnicodeCharRange DoubleWidthCharacterRanges[] = {
        // Hangul Jamo
        {0x1100, 0x11FF},
        // Deprecated fullwidth angle brackets
        {0x2329, 0x232A},
        // CJK Misc, CJK Unified Ideographs, Yijing Hexagrams, Yi
        // excluding U+303F (IDEOGRAPHIC HALF FILL SPACE)
        {0x2E80, 0x303E},
        {0x3040, 0xA4CF},
        // Hangul
        {0xAC00, 0xD7A3},
        {0xD7B0, 0xD7C6},
        {0xD7CB, 0xD7FB},
        // CJK Unified Ideographs
        {0xF900, 0xFAFF},
        // Vertical forms
        {0xFE10, 0xFE19},
        // CJK Compatibility Forms + Small Form Variants
        {0xFE30, 0xFE6F},
        // Fullwidth forms
        {0xFF01, 0xFF60},
        {0xFFE0, 0xFFE6},
        // CJK Unified Ideographs
        {0x20000, 0x2A6DF},
        {0x2A700, 0x2B81F},
        {0x2F800, 0x2FA1F}};
    static const UnicodeCharSet DoubleWidthCharacters(DoubleWidthCharacterRanges);

    if (DoubleWidthCharacters.contains(c))
        return 2;

    return 1;
}